

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O2

bool duckdb::DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,true>
               (DecimalCastData<short> *state)

{
  bool bVar1;
  ExponentType EVar2;
  byte bVar3;
  int iVar4;
  uint8_t uVar5;
  short sVar6;
  int iVar7;
  
  EVar2 = state->exponent_type;
  if ((EVar2 != POSITIVE) &&
     (uVar5 = state->decimal_count - state->scale,
     state->scale <= state->decimal_count && uVar5 != '\0')) {
    state->excessive_decimals = uVar5;
  }
  if (state->excessive_decimals != '\0') {
    bVar1 = TruncateExcessiveDecimals<duckdb::DecimalCastData<short>,true>(state);
    if (!bVar1) {
      return false;
    }
    EVar2 = state->exponent_type;
  }
  if (((EVar2 == NONE) && (state->round_set == true)) && (state->should_round == true)) {
    state->result = state->result + -1;
  }
  sVar6 = state->result;
  for (bVar3 = state->decimal_count; bVar3 < state->scale; bVar3 = bVar3 + 1) {
    sVar6 = sVar6 * 10;
    state->result = sVar6;
  }
  iVar4 = (int)sVar6;
  iVar7 = -(int)state->limit;
  return iVar4 != iVar7 && SBORROW4(iVar4,iVar7) == iVar4 + state->limit < 0;
}

Assistant:

static bool Finalize(T &state) {
		if (state.exponent_type != ExponentType::POSITIVE && state.decimal_count > state.scale) {
			//! Did not encounter an exponent, but ALLOW_EXPONENT was on
			state.excessive_decimals = state.decimal_count - state.scale;
		}
		if (state.excessive_decimals && !TruncateExcessiveDecimals<T, NEGATIVE>(state)) {
			return false;
		}
		if (state.exponent_type == ExponentType::NONE && state.round_set && state.should_round) {
			RoundUpResult<T, NEGATIVE>(state);
		}
		//  if we have not gotten exactly "scale" decimals, we need to multiply the result
		//  e.g. if we have a string "1.0" that is cast to a DECIMAL(9,3), the value needs to be 1000
		//  but we have only gotten the value "10" so far, so we multiply by 1000
		for (uint8_t i = state.decimal_count; i < state.scale; i++) {
			state.result *= 10;
		}
		if (NEGATIVE) {
			return state.result > -state.limit;
		} else {
			return state.result < state.limit;
		}
	}